

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

sequence * toml::detail::syntax::offset_datetime(spec *s)

{
  character_either *in_RDI;
  spec *in_stack_00000048;
  character_either *this;
  sequence *in_stack_ffffffffffffff88;
  character_either *in_stack_ffffffffffffff90;
  sequence *in_stack_ffffffffffffff98;
  sequence *in_stack_ffffffffffffffa0;
  spec *in_stack_ffffffffffffffc8;
  
  this = in_RDI;
  local_date(in_stack_00000048);
  time_delim((spec *)in_stack_ffffffffffffff88);
  full_time(in_stack_ffffffffffffffc8);
  sequence::sequence<toml::detail::sequence,toml::detail::character_either,toml::detail::sequence>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  sequence::~sequence((sequence *)this);
  character_either::~character_either(this);
  sequence::~sequence((sequence *)this);
  return (sequence *)in_RDI;
}

Assistant:

TOML11_INLINE sequence offset_datetime(const spec& s)
{
    return sequence(local_date(s), time_delim(s), full_time(s));
}